

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

string * __thiscall duckdb::UUIDStatisticsState::GetMinValue_abi_cxx11_(UUIDStatisticsState *this)

{
  ulong uVar1;
  char *pcVar2;
  long *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  uVar1 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    pcVar2 = char_ptr_cast<unsigned_char>((uchar *)((long)in_RSI + 9));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar2,0x10,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

string GetMinValue() override {
		return HasStats() ? string(char_ptr_cast(min), 16) : string();
	}